

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64.c
# Opt level: O3

uint64_t roaring64_iterator_read(roaring64_iterator_t *it,uint64_t *buf,uint64_t count)

{
  _Bool _Var1;
  roaring_container_iterator_t rVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  uint16_t low16;
  uint16_t local_3e;
  uint32_t container_consumed;
  art_iterator_t *local_38;
  
  uVar4 = 0;
  if ((count != 0) && (it->has_value != false)) {
    local_38 = &it->art_it;
    uVar4 = 0;
    do {
      uVar3 = *(it->art_it).value;
      low16 = (uint16_t)it->value;
      uVar5 = count - uVar4;
      if (0xfffffffe < uVar5) {
        uVar5 = 0xffffffff;
      }
      _Var1 = container_iterator_read_into_uint64
                        (it->r->containers[uVar3 >> 8],(uint8_t)uVar3,&it->container_it,it->high48,
                         buf,(uint32_t)uVar5,&container_consumed,&low16);
      uVar3 = (ulong)container_consumed;
      uVar4 = uVar4 + uVar3;
      if (_Var1) {
        it->has_value = true;
        it->value = (ulong)low16 | it->high48;
        return uVar4;
      }
      _Var1 = art_iterator_next(local_38);
      it->has_value = _Var1;
      if (!_Var1) {
        return uVar4;
      }
      buf = buf + uVar3;
      uVar3 = (ulong)*(ushort *)((it->art_it).key + 4) << 0x20;
      uVar5 = (ulong)*(uint6 *)(it->art_it).key;
      it->high48 = (uVar3 & 0xff0000000000) >> 0x18 | (uVar3 & 0xff00000000) >> 8 |
                   (uVar5 & 0xff000000) << 8 | (uVar5 & 0xff0000) << 0x18 | (uVar5 & 0xff00) << 0x28
                   | uVar5 << 0x38;
      uVar3 = *(it->art_it).value;
      local_3e = 0;
      rVar2 = container_init_iterator(it->r->containers[uVar3 >> 8],(uint8_t)uVar3,&local_3e);
      (it->container_it).index = rVar2.index;
      it->value = (ulong)local_3e | it->high48;
      it->has_value = true;
    } while (uVar4 < count);
  }
  return uVar4;
}

Assistant:

uint64_t roaring64_iterator_read(roaring64_iterator_t *it, uint64_t *buf,
                                 uint64_t count) {
    uint64_t consumed = 0;
    while (it->has_value && consumed < count) {
        uint32_t container_consumed;
        leaf_t leaf = (leaf_t)*it->art_it.value;
        uint16_t low16 = (uint16_t)it->value;
        uint32_t container_count = UINT32_MAX;
        if (count - consumed < (uint64_t)UINT32_MAX) {
            container_count = count - consumed;
        }
        bool has_value = container_iterator_read_into_uint64(
            get_container(it->r, leaf), get_typecode(leaf), &it->container_it,
            it->high48, buf, container_count, &container_consumed, &low16);
        consumed += container_consumed;
        buf += container_consumed;
        if (has_value) {
            it->has_value = true;
            it->value = it->high48 | low16;
            assert(consumed == count);
            return consumed;
        }
        it->has_value = art_iterator_next(&it->art_it);
        if (it->has_value) {
            roaring64_iterator_init_at_leaf_first(it);
        }
    }
    return consumed;
}